

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void copyNodeContent(MemPage *pFrom,MemPage *pTo,int *pRC)

{
  BtShared *pBVar1;
  u8 *puVar2;
  u8 *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iData;
  int rc;
  int iToHdr;
  int iFromHdr;
  u8 *aTo;
  u8 *aFrom;
  BtShared *pBt;
  int *pRC_local;
  MemPage *pTo_local;
  MemPage *pFrom_local;
  
  if (*pRC == 0) {
    pBVar1 = pFrom->pBt;
    puVar2 = pFrom->aData;
    puVar3 = pTo->aData;
    uVar4 = (uint)pFrom->hdrOffset;
    iVar6 = 0;
    if (pTo->pgno == 1) {
      iVar6 = 100;
    }
    uVar5 = (uint)CONCAT11(puVar2[(int)(uVar4 + 5)],puVar2[(long)(int)(uVar4 + 5) + 1]);
    memcpy(puVar3 + (int)uVar5,puVar2 + (int)uVar5,(ulong)(pBVar1->usableSize - uVar5));
    memcpy(puVar3 + iVar6,puVar2 + (int)uVar4,
           (long)(int)((uint)pFrom->cellOffset + (uint)pFrom->nCell * 2));
    pTo->isInit = '\0';
    iVar6 = btreeInitPage(pTo);
    if (iVar6 == 0) {
      if (pBVar1->autoVacuum != '\0') {
        iVar6 = setChildPtrmaps(pTo);
        *pRC = iVar6;
      }
    }
    else {
      *pRC = iVar6;
    }
  }
  return;
}

Assistant:

static void copyNodeContent(MemPage *pFrom, MemPage *pTo, int *pRC){
  if( (*pRC)==SQLITE_OK ){
    BtShared * const pBt = pFrom->pBt;
    u8 * const aFrom = pFrom->aData;
    u8 * const aTo = pTo->aData;
    int const iFromHdr = pFrom->hdrOffset;
    int const iToHdr = ((pTo->pgno==1) ? 100 : 0);
    int rc;
    int iData;
  
  
    assert( pFrom->isInit );
    assert( pFrom->nFree>=iToHdr );
    assert( get2byte(&aFrom[iFromHdr+5]) <= (int)pBt->usableSize );
  
    /* Copy the b-tree node content from page pFrom to page pTo. */
    iData = get2byte(&aFrom[iFromHdr+5]);
    memcpy(&aTo[iData], &aFrom[iData], pBt->usableSize-iData);
    memcpy(&aTo[iToHdr], &aFrom[iFromHdr], pFrom->cellOffset + 2*pFrom->nCell);
  
    /* Reinitialize page pTo so that the contents of the MemPage structure
    ** match the new data. The initialization of pTo can actually fail under
    ** fairly obscure circumstances, even though it is a copy of initialized 
    ** page pFrom.
    */
    pTo->isInit = 0;
    rc = btreeInitPage(pTo);
    if( rc!=SQLITE_OK ){
      *pRC = rc;
      return;
    }
  
    /* If this is an auto-vacuum database, update the pointer-map entries
    ** for any b-tree or overflow pages that pTo now contains the pointers to.
    */
    if( ISAUTOVACUUM ){
      *pRC = setChildPtrmaps(pTo);
    }
  }
}